

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum
pbrt::G(Integrator *integrator,SamplerHandle *sampler,Vertex *v0,Vertex *v1,
       SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Point3<float> args;
  Point3<float> args_00;
  array<float,_4> aVar3;
  bool bVar4;
  RNG *this;
  Vertex *in_RCX;
  Vertex *in_RDX;
  float fVar5;
  double dVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  Point3f PVar18;
  Vector3<float> VVar19;
  SampledSpectrum SVar20;
  RNG rng;
  Float g;
  Vector3f d;
  RNG *in_stack_00000150;
  SampledWavelengths *in_stack_00000158;
  Interaction *in_stack_00000160;
  Interaction *in_stack_00000168;
  Integrator *in_stack_00000170;
  Vertex *in_stack_fffffffffffffeb8;
  Normal3<float> *in_stack_fffffffffffffec0;
  Float a;
  Point3<float> *in_stack_fffffffffffffec8;
  Vertex *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  Tuple3<pbrt::Vector3,_float> local_44;
  Vertex *local_30;
  Vertex *local_28;
  undefined1 auVar17 [56];
  
  auVar14 = in_ZMM0._8_56_;
  local_30 = in_RCX;
  local_28 = in_RDX;
  PVar18 = Vertex::p(in_stack_fffffffffffffed0);
  auVar7._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar14;
  vmovlpd_avx(auVar7._0_16_);
  PVar18 = Vertex::p(in_stack_fffffffffffffed0);
  auVar8._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar14;
  vmovlpd_avx(auVar8._0_16_);
  VVar19 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_44.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar14;
  local_44._0_8_ = vmovlpd_avx(auVar9._0_16_);
  fVar5 = LengthSquared<float>((Vector3<float> *)&local_44);
  dVar6 = std::sqrt((double)(ulong)(uint)(1.0 / fVar5));
  auVar14 = extraout_var;
  Tuple3<pbrt::Vector3,float>::operator*=((Tuple3<pbrt::Vector3,float> *)&local_44,SUB84(dVar6,0));
  bVar4 = Vertex::IsOnSurface(in_stack_fffffffffffffed0);
  if (bVar4) {
    Vertex::ns(in_stack_fffffffffffffeb8);
    AbsDot<float>(in_stack_fffffffffffffec0,(Vector3<float> *)in_stack_fffffffffffffeb8);
    auVar14 = (undefined1  [56])0x0;
  }
  bVar4 = Vertex::IsOnSurface(in_stack_fffffffffffffed0);
  if (bVar4) {
    Vertex::ns(in_stack_fffffffffffffeb8);
    AbsDot<float>(in_stack_fffffffffffffec0,(Vector3<float> *)in_stack_fffffffffffffeb8);
    auVar14 = (undefined1  [56])0x0;
  }
  PVar18 = Vertex::p(in_stack_fffffffffffffed0);
  auVar10._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar10._8_56_ = auVar14;
  vmovlpd_avx(auVar10._0_16_);
  auVar14 = (undefined1  [56])0x0;
  args.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffef0;
  args.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffee8;
  args.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  this = (RNG *)Hash<pbrt::Point3<float>>(args);
  PVar18 = Vertex::p(in_stack_fffffffffffffed0);
  auVar11._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar14;
  vmovlpd_avx(auVar11._0_16_);
  auVar17 = (undefined1  [56])0x0;
  args_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffef0;
  args_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffee8;
  args_00.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  Hash<pbrt::Point3<float>>(args_00);
  RNG::RNG(this,(uint64_t)in_stack_fffffffffffffeb8,0x7a5736);
  a = (Float)((ulong)this >> 0x20);
  auVar14 = (undefined1  [56])0x0;
  Vertex::GetInteraction(local_28);
  Vertex::GetInteraction(local_30);
  SVar20 = Integrator::Tr(in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
                          in_stack_00000150);
  auVar15._0_8_ = SVar20.values.values._8_8_;
  auVar15._8_56_ = auVar17;
  auVar12._0_8_ = SVar20.values.values._0_8_;
  auVar12._8_56_ = auVar14;
  auVar14 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar12._0_16_);
  vmovlpd_avx(auVar15._0_16_);
  SVar20 = operator*(a,(SampledSpectrum *)in_stack_fffffffffffffeb8);
  auVar16._0_8_ = SVar20.values.values._8_8_;
  auVar16._8_56_ = auVar17;
  auVar13._0_8_ = SVar20.values.values._0_8_;
  auVar13._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar13._0_16_);
  uVar2 = vmovlpd_avx(auVar16._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum G(const Integrator &integrator, SamplerHandle sampler, const Vertex &v0,
                  const Vertex &v1, const SampledWavelengths &lambda) {
    Vector3f d = v0.p() - v1.p();
    Float g = 1 / LengthSquared(d);
    d *= std::sqrt(g);
    if (v0.IsOnSurface())
        g *= AbsDot(v0.ns(), d);
    if (v1.IsOnSurface())
        g *= AbsDot(v1.ns(), d);
    RNG rng(Hash(v0.p()), Hash(v1.p()));
    return g * integrator.Tr(v0.GetInteraction(), v1.GetInteraction(), lambda, rng);
}